

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

uint32_t __thiscall spirv_cross::CompilerMSL::get_uint_type_id(CompilerMSL *this)

{
  uint32_t uVar1;
  undefined1 local_190 [208];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint local_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  uVar1 = this->uint_type_id;
  if (uVar1 == 0) {
    uVar1 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    this->uint_type_id = uVar1;
    local_190._8_8_ = 0x1500000000;
    local_190._0_8_ = &PTR__SPIRType_0048ff28;
    local_190._24_4_ = 1;
    local_190._28_4_ = 1;
    local_190._40_8_ = 0;
    local_190._48_8_ = 8;
    local_190._96_8_ = 0;
    local_190._104_8_ = 8;
    local_190._120_4_ = 0;
    local_190[0x7c] = false;
    local_190[0x7d] = false;
    local_190._128_4_ = 0;
    local_190._132_4_ = 0;
    local_190._136_4_ = 0;
    local_190._140_4_ = 0;
    local_190._144_4_ = Generic;
    local_190._152_8_ = local_190 + 0xb0;
    local_190._160_8_ = 0;
    local_190._168_8_ = 8;
    local_b8 = 0;
    local_b0 = 8;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_88._0_7_ = 0;
    local_88._7_4_ = 0;
    local_6c.id = 0;
    local_88._12_4_ = 0;
    local_88._16_4_ = ImageFormatUnknown;
    local_88._20_4_ = AccessQualifierReadOnly;
    local_88._24_4_ = 0;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_190._16_4_ = UInt;
    local_190._20_4_ = 0x20;
    local_190._32_8_ = local_190 + 0x38;
    local_190._88_8_ = local_190 + 0x70;
    local_c0 = local_a8;
    Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
              ((Compiler *)this,uVar1,(SPIRType *)local_190);
    uVar1 = this->uint_type_id;
    local_190._0_8_ = &PTR__SPIRType_0048ff28;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    local_190._160_8_ = 0;
    if ((TypedID<(spirv_cross::Types)1> *)local_190._152_8_ !=
        (TypedID<(spirv_cross::Types)1> *)(local_190 + 0xb0)) {
      free((void *)local_190._152_8_);
    }
    local_190._96_8_ = 0;
    if ((undefined1 *)local_190._88_8_ != local_190 + 0x70) {
      free((void *)local_190._88_8_);
    }
    local_190._40_8_ = 0;
    if ((undefined1 *)local_190._32_8_ != local_190 + 0x38) {
      free((void *)local_190._32_8_);
    }
  }
  return uVar1;
}

Assistant:

uint32_t CompilerMSL::get_uint_type_id()
{
	if (uint_type_id != 0)
		return uint_type_id;

	uint_type_id = ir.increase_bound_by(1);

	SPIRType type { OpTypeInt };
	type.basetype = SPIRType::UInt;
	type.width = 32;
	set<SPIRType>(uint_type_id, type);
	return uint_type_id;
}